

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O3

int imcomp_nullscaledoubles
              (double *fdata,long tilelen,int *idata,double scale,double zero,int nullcheck,
              double nullflagval,int nullval,int *status)

{
  long lVar1;
  int iVar2;
  double dVar3;
  
  if (nullcheck == 1) {
    if (0 < tilelen) {
      lVar1 = 0;
      do {
        dVar3 = fdata[lVar1];
        if ((dVar3 != nullflagval) || (NAN(dVar3) || NAN(nullflagval))) {
          dVar3 = (dVar3 - zero) / scale;
          if (-2147483648.49 <= dVar3) {
            if (dVar3 <= 2147483647.49) {
              if (0.0 <= dVar3) {
                dVar3 = dVar3 + 0.5;
              }
              else {
                dVar3 = dVar3 + -0.5;
              }
              idata[lVar1] = (int)dVar3;
            }
            else {
              *status = -0xb;
              idata[lVar1] = 0x7fffffff;
            }
          }
          else {
            *status = -0xb;
            idata[lVar1] = -0x80000000;
          }
        }
        else {
          idata[lVar1] = nullval;
        }
        lVar1 = lVar1 + 1;
      } while (tilelen != lVar1);
    }
  }
  else if (0 < tilelen) {
    lVar1 = 0;
    do {
      dVar3 = (fdata[lVar1] - zero) / scale;
      if (-2147483648.49 <= dVar3) {
        if (dVar3 <= 2147483647.49) {
          if (0.0 <= dVar3) {
            dVar3 = dVar3 + 0.5;
          }
          else {
            dVar3 = dVar3 + -0.5;
          }
          iVar2 = (int)dVar3;
        }
        else {
          *status = -0xb;
          iVar2 = 0x7fffffff;
        }
      }
      else {
        *status = -0xb;
        iVar2 = -0x80000000;
      }
      idata[lVar1] = iVar2;
      lVar1 = lVar1 + 1;
    } while (tilelen != lVar1);
  }
  return *status;
}

Assistant:

int imcomp_nullscaledoubles(
     double *fdata,
     long tilelen,
     int *idata, 
     double scale,
     double zero,
     int nullcheck,
     double nullflagval,
     int nullval,
     int *status)
/*
   do null value substitution  of the float array.
   If array value = nullflagval, then set the output value to FLOATNULLVALUE.
   Otherwise, inverse scale the integer value.
*/
{
    long ii;
    double dvalue;
    
    if (nullcheck == 1) /* must check for null values */
    {
      for (ii=0; ii < tilelen; ii++)
      {
        if (fdata[ii] == nullflagval)
	    idata[ii] = nullval;
	else 
	{
            dvalue = (fdata[ii] - zero) / scale;

            if (dvalue < DINT_MIN)
            {
                *status = OVERFLOW_ERR;
                idata[ii] = INT32_MIN;
            }
            else if (dvalue > DINT_MAX)
            {
                *status = OVERFLOW_ERR;
                idata[ii] = INT32_MAX;
            }
            else
            {
                if (dvalue >= 0.)
                    idata[ii] = (int) (dvalue + .5);
                else
                    idata[ii] = (int) (dvalue - .5);
            }
        }
      }
    }
    else  /* don't have to worry about null values */
    {
      for (ii=0; ii < tilelen; ii++)
      {
            dvalue = (fdata[ii] - zero) / scale;

            if (dvalue < DINT_MIN)
            {
                *status = OVERFLOW_ERR;
                idata[ii] = INT32_MIN;
            }
            else if (dvalue > DINT_MAX)
            {
                *status = OVERFLOW_ERR;
                idata[ii] = INT32_MAX;
            }
            else
            {
                if (dvalue >= 0.)
                    idata[ii] = (int) (dvalue + .5);
                else
                    idata[ii] = (int) (dvalue - .5);
            }
      }
    }
    return(*status);
}